

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::GenerateCheckObjType(Lowerer *this,Instr *instrChkObjType)

{
  uint uVar1;
  uint uVar2;
  SymOpnd *this_00;
  Sym *pSVar3;
  code *pcVar4;
  OpndKind OVar5;
  bool bVar6;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar7;
  PropertySymOpnd *this_01;
  JITTimeFunctionBody *pJVar8;
  FunctionJITTimeInfo *this_02;
  char16 *pcVar9;
  char16 *pcVar10;
  LabelInstr *labelObjCheckFailed;
  LabelInstr *branchTarget;
  BranchInstr *instr;
  BailOutInfo *pBVar11;
  Lowerer *this_03;
  char16_t *pcVar12;
  
  OVar5 = IR::Opnd::GetKind(instrChkObjType->m_src1);
  if (OVar5 == OpndKindSym) {
    this_00 = (SymOpnd *)instrChkObjType->m_src1;
    OVar5 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar5 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar6) goto LAB_0059acae;
      *puVar7 = 0;
    }
    bVar6 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (!bVar6) goto LAB_0059a938;
  }
  else {
LAB_0059a938:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x191d,
                       "(instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())"
                       ,
                       "instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()"
                      );
    if (!bVar6) goto LAB_0059acae;
    *puVar7 = 0;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd(instrChkObjType->m_src1);
  bVar6 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if ((!bVar6) || (((this_01->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1922,
                       "(propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked())"
                       ,
                       "propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked()"
                      );
    if (!bVar6) goto LAB_0059acae;
    *puVar7 = 0;
  }
  if (this_01->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) {
    bVar6 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableFieldLoad(this_01->objTypeSpecFldInfo);
    if (bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1924,"(!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())",
                         "!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad()");
      if (!bVar6) goto LAB_0059acae;
      *puVar7 = 0;
    }
  }
  pSVar3 = (this_01->super_SymOpnd).m_sym;
  if (pSVar3->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar6) goto LAB_0059acae;
    *puVar7 = 0;
  }
  uVar1 = this_01->m_inlineCacheIndex;
  pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar8);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,ObjTypeSpecPhase,sourceContextId,functionId)
  ;
  if (bVar6) {
    pcVar9 = Js::OpCodeUtil::GetOpCodeName(instrChkObjType->m_opcode);
    uVar2 = *(uint *)&pSVar3[1]._vptr_Sym;
    pJVar8 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    pcVar10 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar12 = L"ObjTypeSpecFldInfo";
    if (this_01->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
      pcVar12 = L"empty";
    }
    Output::Print(L"Object type check: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pcVar9,(ulong)uVar2,pcVar10,(ulong)uVar1,pcVar12,L"false");
    Output::Flush();
  }
  labelObjCheckFailed = IR::LabelInstr::New(Label,this->m_func,true);
  GenerateCachedTypeCheck
            (this,instrChkObjType,this_01,labelObjCheckFailed,labelObjCheckFailed,(LabelInstr *)0x0)
  ;
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  instr = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrChkObjType,&instr->super_Instr);
  IR::Instr::InsertBefore(instrChkObjType,&labelObjCheckFailed->super_Instr);
  this_03 = (Lowerer *)instrChkObjType;
  IR::Instr::InsertAfter(instrChkObjType,&branchTarget->super_Instr);
  if (((ushort)this_01->field_12 & 8) != 0) {
    GenerateAuxSlotPtrLoad(this_03,this_01,(branchTarget->super_Instr).m_next);
  }
  if ((instrChkObjType->field_0x38 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1943,"(instrChkObjType->HasBailOutInfo())",
                       "instrChkObjType->HasBailOutInfo()");
    if (!bVar6) {
LAB_0059acae:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  pBVar11 = IR::Instr::GetBailOutInfo(instrChkObjType);
  if (pBVar11->bailOutInstr != instrChkObjType) {
    pBVar11 = IR::Instr::GetBailOutInfo(instrChkObjType);
    pBVar11->polymorphicCacheIndex = uVar1;
  }
  IR::Instr::FreeSrc1(instrChkObjType);
  instrChkObjType->m_opcode = BailOut;
  GenerateBailOut(this,instrChkObjType,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return;
}

Assistant:

void
Lowerer::GenerateCheckObjType(IR::Instr * instrChkObjType)
{
    Assert(instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd());
    IR::PropertySymOpnd *propertySymOpnd = instrChkObjType->GetSrc1()->AsPropertySymOpnd();

    // Why do we have an explicit type check if the cached type has been checked upstream?  The dead store pass should have
    // removed this instruction.
    Assert(propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked());
    // Why do we have an explicit type check on a non-configurable root field load?
    Assert(!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad());

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    uint inlineCacheIndex = propertySymOpnd->m_inlineCacheIndex;

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Object type check: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrChkObjType->m_opcode),
        propertySym->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(), _u("false"));

    IR::LabelInstr* labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    this->GenerateCachedTypeCheck(instrChkObjType, propertySymOpnd, labelBailOut, labelBailOut);
    IR::LabelInstr* labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    IR::Instr* instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrChkObjType->InsertBefore(instr);

    // Insert the bailout label here.
    instrChkObjType->InsertBefore(labelBailOut);
    instrChkObjType->InsertAfter(labelDone);

    if (propertySymOpnd->ProducesAuxSlotPtr())
    {
        this->GenerateAuxSlotPtrLoad(propertySymOpnd, labelDone->m_next);
    }

    // Convert the original instruction to a bailout.
    Assert(instrChkObjType->HasBailOutInfo());

    if (instrChkObjType->GetBailOutInfo()->bailOutInstr != instrChkObjType)
    {
        // Set the cache index in the bailout info so that the bailout code will write it into the
        // bailout record at runtime.
        instrChkObjType->GetBailOutInfo()->polymorphicCacheIndex = inlineCacheIndex;
    }

    instrChkObjType->FreeSrc1();
    instrChkObjType->m_opcode = Js::OpCode::BailOut;
    this->GenerateBailOut(instrChkObjType);
}